

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O3

void freelistcell(LispPTR cell)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  DLword *pDVar4;
  dtd *pdVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar3 = (ulong)cell;
  if ((cell & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar4 = Lisp_world;
  uVar9 = cell >> 8 & 0xfffff;
  uVar12 = uVar9 << 9;
  uVar11 = (uint)(uVar3 & 0xff);
  if (uVar11 < 8) {
    error("freeing CONS cell that\'s really freelist ptr");
  }
  uVar1 = *(uint *)((long)pDVar4 + (ulong)uVar12 + 8);
  if (uVar1 < 0x1000000) {
    *(uint *)((long)pDVar4 + (ulong)uVar12 + 8) = uVar1 & 0xffff | uVar11 << 0x10;
    *(undefined1 *)((long)pDVar4 + (uVar3 & 0xff) * 2 + (ulong)uVar12 + 3) = 0;
    goto LAB_00125770;
  }
  uVar7 = uVar1 >> 0x10 & 0xff;
  if (uVar7 == 0) {
    uVar7 = 0;
LAB_00125750:
    *(uint *)((long)pDVar4 + (ulong)uVar12 + 8) = uVar1 & 0xff00ffff | uVar11 << 0x10;
  }
  else {
    uVar10 = 0;
    do {
      uVar8 = uVar7;
      uVar7 = uVar8;
      if ((uVar8 ^ 6) < (uVar11 ^ 6)) break;
      uVar2 = *(uint *)((long)pDVar4 + (ulong)uVar8 * 2 + (ulong)uVar12);
      uVar7 = uVar2 >> 0x18;
      uVar10 = uVar8;
    } while (0xffffff < uVar2);
    uVar7 = uVar7 << 0x18;
    if (uVar10 == 0) goto LAB_00125750;
    *(char *)((long)pDVar4 + (ulong)uVar10 * 2 + (ulong)uVar12 + 3) = (char)cell;
  }
  *(uint *)(pDVar4 + uVar3) = *(uint *)(pDVar4 + uVar3) & 0xffffff | uVar7;
LAB_00125770:
  bVar6 = *(char *)((long)pDVar4 + (ulong)uVar12 + 0xb) + 1;
  *(byte *)((long)pDVar4 + (ulong)uVar12 + 0xb) = bVar6;
  pdVar5 = ListpDTD;
  if ((0x20 < bVar6) && (*(int *)((long)pDVar4 + (ulong)uVar12 + 0xc) == -1)) {
    *(LispPTR *)((long)pDVar4 + (ulong)uVar12 + 0xc) = ListpDTD->dtd_nextpage;
    pdVar5->dtd_nextpage = uVar9;
  }
  return;
}

Assistant:

void freelistcell(LispPTR cell) {
  struct conspage *pbase;
  ConsCell *cell68k;
  unsigned int offset, prior, celloffset;

  cell68k = (ConsCell *)NativeAligned4FromLAddr(cell);
  pbase = (struct conspage *)NativeAligned4FromLPage(POINTER_PAGE(cell));
  celloffset = (LispPTR)cell & 0xFF;
#ifdef NEWCDRCODING
  if (celloffset < 8) error("freeing CONS cell that's really freelist ptr");
#endif /* NEWCDRCODING */

  if (pbase->count) /* There are free cells on the page already */
  {
    prior = 0;

    for (offset = pbase->next_cell; offset; offset = FREECONS(pbase, offset)->next_free) {
#ifdef NEWCDRCODING
      if ((6 ^ offset) < (6 ^ celloffset))
#else
      if (offset < celloffset)
#endif /* NEWCDRCODING */
      {
        break;
      }
      prior = offset;
    }

    if (prior)
      FREECONS(pbase, prior)->next_free = celloffset;
    else
      pbase->next_cell = celloffset;
    ((freecons *)cell68k)->next_free = offset;
  } else /* NO FREE CELLS.  Just replace next_free. */
  {
    pbase->next_cell = celloffset;
    FREECONS(pbase, celloffset)->next_free = 0; /* And this is end of the chain */
  }

  if ((++pbase->count > 32) && (pbase->next_page == CONSPAGE_LAST)) {
    pbase->next_page = ListpDTD->dtd_nextpage;
    ListpDTD->dtd_nextpage = POINTER_PAGE(cell);
  }
}